

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_format(lua_State *L)

{
  int arg;
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  lua_Integer lVar13;
  ushort **ppuVar14;
  void *pvVar15;
  lconv *plVar16;
  undefined1 *puVar17;
  int unaff_EBX;
  char *pcVar18;
  size_t sVar19;
  lua_Number lVar20;
  char form [32];
  size_t l;
  size_t sfl;
  undefined4 local_49c;
  char local_498 [40];
  size_t local_470 [2];
  size_t local_460;
  size_t local_458;
  luaL_Buffer local_450;
  
  local_49c = lua_gettop(L);
  pcVar6 = luaL_checklstring(L,1,&local_458);
  luaL_buffinit(L,&local_450);
  if ((long)local_458 < 1) {
LAB_001180f7:
    luaL_pushresult(&local_450);
    return 1;
  }
  iVar5 = 1;
  pcVar8 = pcVar6;
LAB_00117925:
  if (*pcVar8 != '%') {
    if (local_450.size <= local_450.n) {
      luaL_prepbuffsize(&local_450,1);
    }
    pcVar7 = pcVar8 + 1;
LAB_00117987:
    local_450.b[local_450.n] = *pcVar8;
    local_450.n = local_450.n + 1;
    goto LAB_00117d5f;
  }
  pcVar18 = pcVar8 + 1;
  if (pcVar8[1] == '%') {
    if (local_450.size <= local_450.n) {
      luaL_prepbuffsize(&local_450,1);
    }
    pcVar7 = pcVar8 + 2;
    pcVar8 = pcVar18;
    goto LAB_00117987;
  }
  pcVar8 = luaL_prepbuffsize(&local_450,0x78);
  arg = iVar5 + 1;
  if (local_49c <= iVar5) {
    unaff_EBX = luaL_argerror(L,arg,"no value");
    pcVar7 = pcVar18;
LAB_00117a76:
    bVar2 = false;
    goto LAB_00117d56;
  }
  sVar9 = strspn(pcVar18,"-+#0 123456789.");
  uVar12 = sVar9 + 1;
  if (0x15 < uVar12) {
    luaL_error(L,"invalid format (too long)");
  }
  local_498[0] = '%';
  memcpy(local_498 + 1,pcVar18,uVar12);
  local_498[sVar9 + 2] = '\0';
  pcVar7 = pcVar18 + uVar12;
  bVar1 = pcVar18[sVar9];
  sVar9 = 0x78;
  if (bVar1 < 0x58) {
    if (bVar1 == 0x41) goto switchD_00117a4c_caseD_61;
    if ((bVar1 == 0x45) || (bVar1 == 0x47)) goto switchD_00117a4c_caseD_65;
switchD_00117a4c_caseD_59:
    unaff_EBX = luaL_error(L,"invalid conversion \'%s\' to \'format\'",local_498);
    goto LAB_00117a76;
  }
  pcVar18 = "-+0 ";
  switch(bVar1) {
  case 0x58:
  case 0x6f:
  case 0x78:
    pcVar18 = "-#0";
  case 100:
  case 0x69:
switchD_00117a4c_caseD_64:
    lVar13 = luaL_checkinteger(L,arg);
    checkformat(L,local_498,pcVar18,1);
    addlenmod(local_498,"ll");
    uVar4 = snprintf(pcVar8,0x78,local_498,lVar13);
    break;
  default:
    goto switchD_00117a4c_caseD_59;
  case 0x61:
switchD_00117a4c_caseD_61:
    checkformat(L,local_498,"-+#0 ",1);
    addlenmod(local_498,"");
    lVar20 = luaL_checknumber(L,arg);
    sVar9 = 0x78;
    goto LAB_00117c6c;
  case 99:
    checkformat(L,local_498,"-",0);
    uVar12 = luaL_checkinteger(L,arg);
    uVar4 = snprintf(pcVar8,0x78,local_498,uVar12 & 0xffffffff);
    break;
  case 0x65:
  case 0x67:
    goto switchD_00117a4c_caseD_65;
  case 0x66:
    sVar9 = 0x1a2;
    pcVar8 = luaL_prepbuffsize(&local_450,0x1a2);
    goto switchD_00117a4c_caseD_65;
  case 0x70:
    pcVar18 = (char *)lua_topointer(L,arg);
    checkformat(L,local_498,"-",0);
    if (pcVar18 == (char *)0x0) {
      sVar9 = strlen(local_498);
      local_498[sVar9 - 1] = 's';
      pcVar18 = "(null)";
    }
    uVar4 = snprintf(pcVar8,0x78,local_498,pcVar18);
    break;
  case 0x71:
    if (local_498[2] != '\0') {
      unaff_EBX = luaL_error(L,"specifier \'%%q\' cannot have modifiers");
      goto LAB_00117a76;
    }
    uVar4 = lua_type(L,arg);
    if (uVar4 < 2) {
      uVar4 = 0;
      luaL_tolstring(L,arg,(size_t *)0x0);
      luaL_addvalue(&local_450);
      break;
    }
    if (uVar4 == 3) {
      pcVar8 = luaL_prepbuffsize(&local_450,0x78);
      iVar5 = lua_isinteger(L,arg);
      if (iVar5 == 0) {
        lVar20 = lua_tonumberx(L,arg,(int *)0x0);
        pcVar18 = "1e9999";
        if (((INFINITY <= lVar20) || (pcVar18 = "-1e9999", lVar20 <= -INFINITY)) ||
           (pcVar18 = "(0/0)", NAN(lVar20))) {
          pcVar11 = "%s";
          goto LAB_0011805e;
        }
        uVar4 = snprintf(pcVar8,0x78,"%a","(0/0)");
        uVar12 = (ulong)uVar4;
        pvVar15 = memchr(pcVar8,0x2e,(ulong)uVar4);
        if (pvVar15 == (void *)0x0) {
          plVar16 = localeconv();
          puVar17 = (undefined1 *)memchr(pcVar8,(int)*plVar16->decimal_point,(ulong)uVar4);
          if (puVar17 != (undefined1 *)0x0) {
            *puVar17 = 0x2e;
          }
        }
      }
      else {
        pcVar18 = (char *)lua_tointegerx(L,arg,(int *)0x0);
        pcVar11 = "%lld";
LAB_0011805e:
        uVar4 = snprintf(pcVar8,0x78,pcVar11,pcVar18);
        uVar12 = (ulong)uVar4;
      }
      local_450.n = local_450.n + uVar12;
    }
    else {
      if (uVar4 == 4) {
        pcVar8 = lua_tolstring(L,arg,&local_460);
        sVar3 = local_460;
        if (local_450.size <= local_450.n) {
          luaL_prepbuffsize(&local_450,1);
        }
        uVar12 = local_450.n + 1;
        local_450.b[local_450.n] = '\"';
        local_450.n = uVar12;
        if (sVar3 != 0) {
          sVar19 = 0;
          do {
            bVar1 = pcVar8[sVar19];
            if (((bVar1 == 10) || (bVar1 == 0x5c)) || (bVar1 == 0x22)) {
              if (local_450.size <= local_450.n) {
                luaL_prepbuffsize(&local_450,1);
              }
              local_450.b[local_450.n] = '\\';
              local_450.n = local_450.n + 1;
LAB_00117e67:
              if (local_450.size <= local_450.n) {
                luaL_prepbuffsize(&local_450,1);
              }
              local_450.b[local_450.n] = pcVar8[sVar19];
              local_450.n = local_450.n + 1;
            }
            else {
              ppuVar14 = __ctype_b_loc();
              if (((*ppuVar14)[bVar1] & 2) == 0) goto LAB_00117e67;
              pcVar18 = "\\%03d";
              if (((*ppuVar14)[(byte)pcVar8[sVar19 + 1]] >> 0xb & 1) == 0) {
                pcVar18 = "\\%d";
              }
              snprintf((char *)local_470,10,pcVar18,(ulong)(uint)bVar1);
              luaL_addstring(&local_450,(char *)local_470);
            }
            sVar19 = sVar19 + 1;
          } while (sVar3 != sVar19);
        }
        if (local_450.size <= local_450.n) {
          luaL_prepbuffsize(&local_450,1);
        }
        local_450.b[local_450.n] = '\"';
        local_450.n = local_450.n + 1;
        goto LAB_00117f21;
      }
      luaL_argerror(L,arg,"value has no literal form");
    }
    uVar4 = 0;
    break;
  case 0x73:
    pcVar18 = luaL_tolstring(L,arg,local_470);
    sVar9 = local_470[0];
    if (local_498[2] == '\0') {
      luaL_addvalue(&local_450);
LAB_00117f21:
      uVar4 = 0;
    }
    else {
      sVar10 = strlen(pcVar18);
      if (sVar9 != sVar10) {
        luaL_argerror(L,arg,"string contains zeros");
      }
      checkformat(L,local_498,"-",1);
      pcVar11 = strchr(local_498,0x2e);
      if ((pcVar11 == (char *)0x0) && (99 < local_470[0])) {
        luaL_addvalue(&local_450);
        uVar4 = 0;
      }
      else {
        uVar4 = snprintf(pcVar8,0x78,local_498,pcVar18);
        lua_settop(L,-2);
      }
    }
    break;
  case 0x75:
    pcVar18 = "-0";
    goto switchD_00117a4c_caseD_64;
  }
LAB_00117d48:
  local_450.n = local_450.n + uVar4;
  bVar2 = true;
LAB_00117d56:
  iVar5 = arg;
  if (!bVar2) {
    return unaff_EBX;
  }
LAB_00117d5f:
  pcVar8 = pcVar7;
  if (pcVar6 + local_458 <= pcVar7) goto LAB_001180f7;
  goto LAB_00117925;
switchD_00117a4c_caseD_65:
  lVar20 = luaL_checknumber(L,arg);
  checkformat(L,local_498,"-+#0 ",1);
  addlenmod(local_498,"");
LAB_00117c6c:
  uVar4 = snprintf(pcVar8,sVar9,local_498,lVar20);
  goto LAB_00117d48;
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  const char *flags;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      unsigned maxitem = MAX_ITEM;  /* maximum length for the result */
      char *buff = luaL_prepbuffsize(&b, maxitem);  /* to put result */
      int nb = 0;  /* number of bytes in result */
      if (++arg > top)
        return luaL_argerror(L, arg, "no value");
      strfrmt = getformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          checkformat(L, form, L_FMTFLAGSC, 0);
          nb = l_sprintf(buff, maxitem, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
          flags = L_FMTFLAGSI;
          goto intcase;
        case 'u':
          flags = L_FMTFLAGSU;
          goto intcase;
        case 'o': case 'x': case 'X':
          flags = L_FMTFLAGSX;
         intcase: {
          lua_Integer n = luaL_checkinteger(L, arg);
          checkformat(L, form, flags, 1);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          checkformat(L, form, L_FMTFLAGSF, 1);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, maxitem, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'f':
          maxitem = MAX_ITEMF;  /* extra space for '%f' */
          buff = luaL_prepbuffsize(&b, maxitem);
          /* FALLTHROUGH */
        case 'e': case 'E': case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          checkformat(L, form, L_FMTFLAGSF, 1);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'p': {
          const void *p = lua_topointer(L, arg);
          checkformat(L, form, L_FMTFLAGSC, 0);
          if (p == NULL) {  /* avoid calling 'printf' with argument NULL */
            p = "(null)";  /* result */
            form[strlen(form) - 1] = 's';  /* format it as a string */
          }
          nb = l_sprintf(buff, maxitem, form, p);
          break;
        }
        case 'q': {
          if (form[2] != '\0')  /* modifiers? */
            return luaL_error(L, "specifier '%%q' cannot have modifiers");
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            checkformat(L, form, L_FMTFLAGSC, 1);
            if (strchr(form, '.') == NULL && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, maxitem, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid conversion '%s' to 'format'", form);
        }
      }
      lua_assert(cast_uint(nb) < maxitem);
      luaL_addsize(&b, cast_uint(nb));
    }
  }
  luaL_pushresult(&b);
  return 1;
}